

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abstractscrollarea.cpp
# Opt level: O1

void __thiscall
QtMWidgets::AbstractScrollArea::mouseMoveEvent(AbstractScrollArea *this,QMouseEvent *e)

{
  QPoint QVar1;
  int dy;
  int dx;
  QMouseEvent QVar2;
  double dVar3;
  double extraout_XMM1_Qa;
  undefined1 auVar4 [16];
  
  QVar2 = (QMouseEvent)(((this->d).d)->leftMouseButtonPressed == true);
  if ((bool)QVar2) {
    QEventPoint::position();
    dy = (int)((double)((ulong)extraout_XMM1_Qa & 0x8000000000000000 | (ulong)DAT_00182940) +
              extraout_XMM1_Qa) - (((this->d).d)->mousePos).yp;
    dVar3 = (double)QEventPoint::position();
    dx = (int)((double)((ulong)dVar3 & 0x8000000000000000 | (ulong)DAT_00182940) + dVar3) -
         (((this->d).d)->mousePos).xp;
    auVar4 = QEventPoint::position();
    QVar1.xp = (int)((double)((ulong)auVar4._0_8_ & 0x8000000000000000 | 0x3fe0000000000000) +
                    auVar4._0_8_);
    QVar1.yp = (int)((double)((ulong)auVar4._8_8_ & 0x8000000000000000 | 0x3fe0000000000000) +
                    auVar4._8_8_);
    ((this->d).d)->mousePos = QVar1;
    AbstractScrollAreaPrivate::scrollContentsBy((this->d).d,dx,dy);
    (**(code **)(*(long *)this + 0x1b0))(this,dx,dy);
  }
  e[0xc] = QVar2;
  return;
}

Assistant:

void
AbstractScrollArea::mouseMoveEvent( QMouseEvent * e )
{
	if( d->leftMouseButtonPressed )
	{
		const int dy = e->pos().y() - d->mousePos.y();
		const int dx = e->pos().x() - d->mousePos.x();

		d->mousePos = e->pos();

		d->scrollContentsBy( dx, dy );

		scrollContentsBy( dx, dy );

		e->accept();
	}
	else
		e->ignore();
}